

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.h
# Opt level: O0

ON_3dPoint * __thiscall
ON_3dPointListRef::operator[]
          (ON_3dPoint *__return_storage_ptr__,ON_3dPointListRef *this,int point_index)

{
  double *pdVar1;
  float *pfVar2;
  float *p_1;
  double *p;
  double buffer [3];
  int point_index_local;
  ON_3dPointListRef *this_local;
  
  if ((point_index < 0) || (this->m_point_count <= (uint)point_index)) {
    buffer[1] = -1.23432101234321e+308;
    buffer[0] = -1.23432101234321e+308;
    p = (double *)0xffe5f8bd9e331dd2;
  }
  else if (this->m_dP == (double *)0x0) {
    pfVar2 = this->m_fP + point_index * this->m_point_stride;
    p = (double *)(double)*pfVar2;
    buffer[0] = (double)pfVar2[1];
    buffer[1] = (double)pfVar2[2];
  }
  else {
    pdVar1 = this->m_dP + point_index * this->m_point_stride;
    p = (double *)*pdVar1;
    buffer[0] = pdVar1[1];
    buffer[1] = pdVar1[2];
  }
  __return_storage_ptr__->x = (double)p;
  __return_storage_ptr__->y = buffer[0];
  __return_storage_ptr__->z = buffer[1];
  return __return_storage_ptr__;
}

Assistant:

inline ON_3dPoint operator[](int point_index) const
  {
    double buffer[3];
    if ( point_index >= 0 && ((unsigned int)point_index) < m_point_count )
    {
      if ( m_dP )
      {
        const double* p = m_dP + (point_index*m_point_stride);
        buffer[0]  = *p++;
        buffer[1]  = *p++;
        buffer[2]  = *p;
      }
      else
      {
        const float* p = m_fP + (point_index*m_point_stride);
        buffer[0]  = *p++;
        buffer[1]  = *p++;
        buffer[2]  = *p;
      }
    }
    else
    {
      buffer[0] = buffer[1] = buffer[2] = ON_UNSET_VALUE;
    }
    return *((const ON_3dPoint*)buffer);  
  }